

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

half Imf_2_5::uintToHalf(uint ui)

{
  undefined8 in_RAX;
  uint in_EDI;
  float in_stack_0000000c;
  half *in_stack_00000010;
  undefined2 local_2;
  
  local_2 = (unsigned_short)((ulong)in_RAX >> 0x30);
  if ((double)in_EDI <= 65504.0) {
    ::half::half(in_stack_00000010,in_stack_0000000c);
  }
  else {
    local_2 = ::half::posInf();
  }
  return (half)local_2;
}

Assistant:

half	
uintToHalf (unsigned int ui)
{
    if (ui >  HALF_MAX)
	return half::posInf();

    return half ((float) ui);
}